

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionTaperedTimoshenkoFPM.cpp
# Opt level: O1

ChMatrixNM<double,_6,_6> * __thiscall
chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGenericFPM::GetMlawAtPoint
          (ChMatrixNM<double,_6,_6> *__return_storage_ptr__,
          ChBeamSectionTaperedTimoshenkoAdvancedGenericFPM *this,double eta)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double *pdVar9;
  double *pdVar10;
  ActualDstType actualDst;
  
  dVar1 = (1.0 - eta) * 0.5;
  dVar2 = (eta + 1.0) * 0.5;
  pdVar9 = (double *)
           (**(code **)(*(long *)(this->section_fpmA).
                                 super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGenericFPM,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr + 0x1d8))();
  pdVar10 = (double *)
            (**(code **)(*(long *)(this->section_fpmB).
                                  super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGenericFPM,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr + 0x1d8))();
  dVar3 = pdVar9[1];
  dVar4 = pdVar9[2];
  dVar5 = pdVar9[3];
  dVar6 = pdVar10[1];
  dVar7 = pdVar10[2];
  dVar8 = pdVar10[3];
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.
  m_data.array[0] = dVar1 * *pdVar9 + dVar2 * *pdVar10;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.
  m_data.array[1] = dVar1 * dVar3 + dVar2 * dVar6;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.
  m_data.array[2] = dVar1 * dVar4 + dVar2 * dVar7;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.
  m_data.array[3] = dVar1 * dVar5 + dVar2 * dVar8;
  dVar3 = pdVar9[5];
  dVar4 = pdVar9[6];
  dVar5 = pdVar9[7];
  dVar6 = pdVar10[5];
  dVar7 = pdVar10[6];
  dVar8 = pdVar10[7];
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.
  m_data.array[4] = dVar1 * pdVar9[4] + dVar2 * pdVar10[4];
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.
  m_data.array[5] = dVar1 * dVar3 + dVar2 * dVar6;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.
  m_data.array[6] = dVar1 * dVar4 + dVar2 * dVar7;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.
  m_data.array[7] = dVar1 * dVar5 + dVar2 * dVar8;
  dVar3 = pdVar9[9];
  dVar4 = pdVar9[10];
  dVar5 = pdVar9[0xb];
  dVar6 = pdVar10[9];
  dVar7 = pdVar10[10];
  dVar8 = pdVar10[0xb];
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.
  m_data.array[8] = dVar1 * pdVar9[8] + dVar2 * pdVar10[8];
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.
  m_data.array[9] = dVar1 * dVar3 + dVar2 * dVar6;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.
  m_data.array[10] = dVar1 * dVar4 + dVar2 * dVar7;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.
  m_data.array[0xb] = dVar1 * dVar5 + dVar2 * dVar8;
  dVar3 = pdVar9[0xd];
  dVar4 = pdVar9[0xe];
  dVar5 = pdVar9[0xf];
  dVar6 = pdVar10[0xd];
  dVar7 = pdVar10[0xe];
  dVar8 = pdVar10[0xf];
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.
  m_data.array[0xc] = dVar1 * pdVar9[0xc] + dVar2 * pdVar10[0xc];
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.
  m_data.array[0xd] = dVar1 * dVar3 + dVar2 * dVar6;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.
  m_data.array[0xe] = dVar1 * dVar4 + dVar2 * dVar7;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.
  m_data.array[0xf] = dVar1 * dVar5 + dVar2 * dVar8;
  dVar3 = pdVar9[0x11];
  dVar4 = pdVar9[0x12];
  dVar5 = pdVar9[0x13];
  dVar6 = pdVar10[0x11];
  dVar7 = pdVar10[0x12];
  dVar8 = pdVar10[0x13];
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.
  m_data.array[0x10] = dVar1 * pdVar9[0x10] + dVar2 * pdVar10[0x10];
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.
  m_data.array[0x11] = dVar1 * dVar3 + dVar2 * dVar6;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.
  m_data.array[0x12] = dVar1 * dVar4 + dVar2 * dVar7;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.
  m_data.array[0x13] = dVar1 * dVar5 + dVar2 * dVar8;
  dVar3 = pdVar9[0x15];
  dVar4 = pdVar9[0x16];
  dVar5 = pdVar9[0x17];
  dVar6 = pdVar10[0x15];
  dVar7 = pdVar10[0x16];
  dVar8 = pdVar10[0x17];
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.
  m_data.array[0x14] = dVar1 * pdVar9[0x14] + dVar2 * pdVar10[0x14];
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.
  m_data.array[0x15] = dVar1 * dVar3 + dVar2 * dVar6;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.
  m_data.array[0x16] = dVar1 * dVar4 + dVar2 * dVar7;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.
  m_data.array[0x17] = dVar1 * dVar5 + dVar2 * dVar8;
  dVar3 = pdVar9[0x19];
  dVar4 = pdVar9[0x1a];
  dVar5 = pdVar9[0x1b];
  dVar6 = pdVar10[0x19];
  dVar7 = pdVar10[0x1a];
  dVar8 = pdVar10[0x1b];
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.
  m_data.array[0x18] = dVar1 * pdVar9[0x18] + dVar2 * pdVar10[0x18];
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.
  m_data.array[0x19] = dVar1 * dVar3 + dVar2 * dVar6;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.
  m_data.array[0x1a] = dVar1 * dVar4 + dVar2 * dVar7;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.
  m_data.array[0x1b] = dVar1 * dVar5 + dVar2 * dVar8;
  dVar3 = pdVar9[0x1d];
  dVar4 = pdVar9[0x1e];
  dVar5 = pdVar9[0x1f];
  dVar6 = pdVar10[0x1d];
  dVar7 = pdVar10[0x1e];
  dVar8 = pdVar10[0x1f];
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.
  m_data.array[0x1c] = dVar1 * pdVar9[0x1c] + dVar2 * pdVar10[0x1c];
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.
  m_data.array[0x1d] = dVar1 * dVar3 + dVar2 * dVar6;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.
  m_data.array[0x1e] = dVar1 * dVar4 + dVar2 * dVar7;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.
  m_data.array[0x1f] = dVar1 * dVar5 + dVar2 * dVar8;
  dVar3 = pdVar9[0x21];
  dVar4 = pdVar9[0x22];
  dVar5 = pdVar9[0x23];
  dVar6 = pdVar10[0x21];
  dVar7 = pdVar10[0x22];
  dVar8 = pdVar10[0x23];
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.
  m_data.array[0x20] = dVar1 * pdVar9[0x20] + dVar2 * pdVar10[0x20];
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.
  m_data.array[0x21] = dVar1 * dVar3 + dVar2 * dVar6;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.
  m_data.array[0x22] = dVar1 * dVar4 + dVar2 * dVar7;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.
  m_data.array[0x23] = dVar1 * dVar5 + dVar2 * dVar8;
  return __return_storage_ptr__;
}

Assistant:

ChMatrixNM<double, 6, 6> ChBeamSectionTaperedTimoshenkoAdvancedGenericFPM::GetMlawAtPoint(const double eta) {
    // calculate cross-sectional material mass matrix Mlaw at dimensionless point eta, by linear interpolation
    // eta = (-1,1)
    double Nx1 = (1. / 2.) * (1 - eta);
    double Nx2 = (1. / 2.) * (1 + eta);
    ChMatrixNM<double, 6, 6> Mlaw_point =
        Nx1 * this->section_fpmA->GetMassMatrixFPM() + Nx2 * this->section_fpmB->GetMassMatrixFPM();

    return Mlaw_point;
}